

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListOverlay.cpp
# Opt level: O2

void __thiscall cursespp::ListOverlay::Layout(ListOverlay *this)

{
  uint uVar1;
  element_type *peVar2;
  _func_int **pp_Var3;
  element_type *peVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  undefined8 uVar8;
  uint uVar9;
  
  RecalculateSize(this);
  if ((0 < this->width) && (0 < this->height)) {
    (*(this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IOrderable.
      _vptr_IOrderable[0x15])(this,(ulong)(uint)this->x,(ulong)(uint)this->y);
    bVar5 = ScrollbarVisible(this);
    iVar7 = (*(this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IOrderable
              ._vptr_IOrderable[0x19])(this);
    uVar9 = this->height - 4;
    uVar1 = iVar7 - 4;
    if (!bVar5) {
      uVar1 = iVar7 - 2U;
    }
    peVar2 = (this->listWindow).
             super___shared_ptr<cursespp::ListOverlay::CustomListWindow,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (**(code **)(*(long *)&(peVar2->super_ListWindow).super_ScrollableWindow.super_Window.
                           super_IWindow.super_IOrderable + 0xa8))(peVar2,1,2,uVar1,uVar9);
    uVar8 = (**(code **)(*(long *)&(((this->listWindow).
                                     super___shared_ptr<cursespp::ListOverlay::CustomListWindow,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->super_ListWindow).super_ScrollableWindow.super_Window.
                                   super_IWindow.super_IOrderable + 0x228))();
    peVar2 = (this->listWindow).
             super___shared_ptr<cursespp::ListOverlay::CustomListWindow,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    cVar6 = (**(code **)(*(long *)&(peVar2->super_ListWindow).super_ScrollableWindow.super_Window.
                                   super_IWindow.super_IOrderable + 0x238))(peVar2,uVar8);
    if (cVar6 == '\0') {
      peVar2 = (this->listWindow).
               super___shared_ptr<cursespp::ListOverlay::CustomListWindow,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      (**(code **)(*(long *)&(peVar2->super_ListWindow).super_ScrollableWindow.super_Window.
                             super_IWindow.super_IOrderable + 0x220))(peVar2,uVar8);
    }
    pp_Var3 = (((this->scrollbar).super___shared_ptr<cursespp::Window,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_IWindow).super_IOrderable._vptr_IOrderable;
    if (bVar5) {
      (*pp_Var3[0x2b])();
      peVar4 = (this->scrollbar).super___shared_ptr<cursespp::Window,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (*(peVar4->super_IWindow).super_IOrderable._vptr_IOrderable[0x15])
                (peVar4,(ulong)(iVar7 - 2U),2,1,(ulong)uVar9);
    }
    else {
      (*pp_Var3[0x2c])();
    }
    UpdateContents(this);
    return;
  }
  return;
}

Assistant:

void ListOverlay::Layout() {
    this->RecalculateSize();

    if (this->width > 0 && this->height > 0) {
        this->MoveAndResize(
            this->x,
            this->y,
            this->width,
            this->height);

        bool scrollbar = this->ScrollbarVisible();
        auto contentWidth = this->GetContentWidth() - 2; /* subtract padding */
        auto contentHeight = this->height - 4; /* top and bottom padding + title */
        auto startX = 1; /* L padding */
        auto startY = 2; /* below the title, plus an extra space */
        auto listWidth = scrollbar ? contentWidth - 2 : contentWidth;

        this->listWindow->MoveAndResize(startX, startY, listWidth, contentHeight);

        auto index = this->listWindow->GetSelectedIndex();
        if (!this->listWindow->IsEntryVisible(index)) {
            this->listWindow->ScrollTo(index);
        }

        if (scrollbar) {
            this->scrollbar->Show();
            this->scrollbar->MoveAndResize(contentWidth, startY, 1, contentHeight);
        }
        else {
            this->scrollbar->Hide();
        }

        this->UpdateContents();
    }
}